

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O1

Abc_Obj_t * Dec_SopToAig(Abc_Ntk_t *pNtk,char *pSop,Vec_Ptr_t *vFaninAigs)

{
  Dec_Graph_t *pGraph;
  long lVar1;
  Abc_Obj_t *pAVar2;
  long lVar3;
  
  pGraph = Dec_Factor(pSop);
  if (0 < pGraph->nLeaves) {
    lVar1 = 1;
    lVar3 = 0;
    do {
      if (vFaninAigs->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      *(void **)(&pGraph->pNodes->eEdge0 + lVar1 * 2) = vFaninAigs->pArray[lVar3];
      lVar3 = lVar3 + 1;
      lVar1 = lVar1 + 3;
    } while (lVar3 < pGraph->nLeaves);
  }
  pAVar2 = Dec_GraphToNetwork(pNtk,pGraph);
  if (pGraph->pNodes != (Dec_Node_t *)0x0) {
    free(pGraph->pNodes);
    pGraph->pNodes = (Dec_Node_t *)0x0;
  }
  if (pGraph != (Dec_Graph_t *)0x0) {
    free(pGraph);
  }
  return pAVar2;
}

Assistant:

Abc_Obj_t * Dec_SopToAig( Abc_Ntk_t * pNtk, char * pSop, Vec_Ptr_t * vFaninAigs )
{
    Abc_Obj_t * pFunc;
    Dec_Graph_t * pFForm;
    Dec_Node_t * pNode;
    int i;
    pFForm = Dec_Factor( pSop );
    Dec_GraphForEachLeaf( pFForm, pNode, i )
        pNode->pFunc = Vec_PtrEntry( vFaninAigs, i );
    pFunc = Dec_GraphToNetwork( pNtk, pFForm );
    Dec_GraphFree( pFForm );
    return pFunc;
}